

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O3

void __thiscall
AI::HierarchicalTaskNetworkComponent::createPlan
          (HierarchicalTaskNetworkComponent *this,TaskIdentifier goal)

{
  TaskParameters *parameters;
  bool *pbVar1;
  _Rb_tree_header *p_Var2;
  pointer pTVar3;
  pointer pTVar4;
  World *this_00;
  GameMode *this_01;
  TaskDatabase *taskDatabase;
  mapped_type *initialTask;
  TaskIdentifier local_cc;
  Plan local_c8;
  vector<AI::Task,_std::allocator<AI::Task>_> local_48;
  
  local_cc = goal;
  this_00 = Component::getWorld(&this->super_Component);
  this_01 = World::getAuthGameMode(this_00);
  taskDatabase = GameMode::getAvailableTasks(this_01);
  initialTask = std::
                map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
                ::operator[](&taskDatabase->tasks,&local_cc);
  parameters = &(this->planner).parameters;
  generatePlan(&local_c8,initialTask,&this->state,&this->worldQuerySystem,parameters,taskDatabase);
  local_48.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_c8.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.super__Vector_impl_data.
  _M_finish = (this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  (this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_c8.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c8.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_c8.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::~vector(&local_48);
  (this->planner).plan.currentTask._M_current = local_c8.currentTask._M_current;
  pTVar3 = (this->planner).plan.planPath.
           super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar4 = (this->planner).plan.planPath.
           super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->planner).plan.planPath.
  super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_c8.planPath.super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->planner).plan.planPath.
  super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c8.planPath.super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->planner).plan.planPath.
  super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_c8.planPath.super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c8.planPath.super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.planPath.super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.planPath.super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)pTVar4 - (long)pTVar3);
  }
  (this->planner).plan.currentPathVertex._M_current = local_c8.currentPathVertex._M_current;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&(this->planner).plan.implementationsUsed._M_t);
  if (local_c8.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)0x0) {
    p_Var2 = &local_c8.implementationsUsed._M_t._M_impl.super__Rb_tree_header;
    (this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_c8.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    *(_Base_ptr *)
     ((long)&(this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header +
     8) = local_c8.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    *(_Base_ptr *)
     ((long)&(this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header +
     0x10) = local_c8.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    *(_Base_ptr *)
     ((long)&(this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header +
     0x18) = local_c8.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_c8.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent
         = &(this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header;
    (this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_c8.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_c8.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_c8.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var2->_M_header;
    local_c8.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var2->_M_header;
  }
  pbVar1 = &(this->planner).plan.failed;
  (this->planner).plan.hasCurrentTask = local_c8.hasCurrentTask;
  (this->planner).plan.failed = local_c8.failed;
  (this->planner).plan.finished = local_c8.finished;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_c8.implementationsUsed._M_t);
  if (local_c8.planPath.super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.planPath.
                    super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.planPath.
                          super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.planPath.
                          super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<AI::Task,_std::allocator<AI::Task>_>::~vector(&local_c8.tasks);
  if (*pbVar1 == true) {
    fixFailedPlan(&(this->planner).plan,&this->state,parameters,taskDatabase);
    if (*pbVar1 == true) {
      createPlan(this,Null);
    }
  }
  Plan::start(&(this->planner).plan);
  updateHUD_PlanPath(this);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::createPlan(TaskIdentifier goal)
{
	auto& tasks = getWorld()->getAuthGameMode()->getAvailableTasks();
	planner.plan = generatePlan(tasks.tasks[goal], state, worldQuerySystem, planner.parameters, tasks);

	if (planner.plan.failed)
	{
		fixFailedPlan(planner.plan, state, planner.parameters, tasks);

		if (planner.plan.failed)
		{
			createPlan(TaskIdentifier::Null);
		}
	}

	planner.plan.start();
	updateHUD_PlanPath();
}